

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  keyact kVar4;
  _Bool _Var5;
  int iVar6;
  int iVar7;
  size_t n;
  bool bVar8;
  keyact action;
  cmdline_key_action **ppcVar9;
  char *__format;
  char *pcVar10;
  char **ppcVar11;
  bool bVar12;
  size_t sStack_60;
  int local_4c;
  char *local_48;
  char *local_40;
  FILE *local_38;
  
  progname = *argv;
  bVar2 = 1;
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_38 = (FILE *)0x0;
  iVar7 = argc;
  kVar4 = KEYACT_AGENT_LOAD;
LAB_0010afd9:
  action = kVar4;
  local_4c = iVar7;
  ppcVar11 = argv;
  if (local_4c < 2) {
    if ((life == CS_ISO8859_4) && (exec_args == (char **)0x0)) {
LAB_0010b669:
      pcVar10 = "pageant: expected a command with --exec\n";
      sStack_60 = 0x28;
    }
    else {
      if ((display == (char *)0x0) &&
         ((display = getenv("DISPLAY"), display != (char *)0x0 && (*display == '\0')))) {
        display = (char *)0x0;
      }
      if (local_40 != (char *)0x0) {
        pcVar10 = askpass(local_40);
        if (pcVar10 != (char *)0x0) {
          puts(pcVar10);
          fflush(_stdout);
          n = strlen(pcVar10);
          smemclr(pcVar10,n);
          safefree(pcVar10);
          return 0;
        }
        return 1;
      }
      putty_signal(0xd,(_func_void_int *)0x1);
      sk_init();
      uxsel_init();
      ppcVar9 = &keyact_head;
      bVar8 = false;
      bVar3 = false;
      while (ppcVar9 = &((cmdline_key_action *)ppcVar9)->next->next,
            (cmdline_key_action *)ppcVar9 != (cmdline_key_action *)0x0) {
        bVar12 = ((cmdline_key_action *)ppcVar9)->action < KEYACT_CLIENT_ADD;
        if (!bVar12) {
          bVar3 = true;
        }
        bVar8 = (bool)(bVar8 | bVar12);
      }
      if (life == ADDRTYPE_UNSPEC) {
        if (bVar8) {
          pcVar10 = "pageant: expected an agent lifetime option with bare key file arguments\n";
          sStack_60 = 0x48;
        }
        else {
          if (bVar3) {
            run_client();
            return 0;
          }
          pcVar10 = "pageant: expected an agent lifetime option or a client key action\n";
          sStack_60 = 0x42;
        }
      }
      else {
        if (!bVar3) {
          run_agent((FILE *)local_38,local_48);
          return 0;
        }
        pcVar10 = 
        "pageant: client key actions (-a, -d, -D, -r, -R, -l, -L) do not go with an agent lifetime option\n"
        ;
        sStack_60 = 0x61;
      }
    }
LAB_0010b67c:
    fwrite(pcVar10,sStack_60,1,_stderr);
    goto LAB_0010b685;
  }
  iVar7 = local_4c + -1;
  pcVar10 = ppcVar11[1];
  argv = ppcVar11 + 1;
  if (!(bool)(*pcVar10 == '-' & bVar2)) {
    add_keyact(action,pcVar10);
    kVar4 = action;
    goto LAB_0010afd9;
  }
  if (((pcVar10[1] == 'V') && (pcVar10[2] == '\0')) ||
     (iVar6 = strcmp(pcVar10,"--version"), iVar6 == 0)) {
    pcVar10 = buildinfo("\n");
    printf("pageant: %s\n%s\n","Unidentified build",pcVar10);
    safefree(pcVar10);
    exit(0);
  }
  iVar6 = strcmp(pcVar10,"--help");
  if (iVar6 == 0) {
    usage();
    goto LAB_0010b669;
  }
  if ((pcVar10[1] == 'v') && (pcVar10[2] == '\0')) {
    local_38 = _stderr;
LAB_0010b2c8:
    bVar2 = 1;
    kVar4 = action;
    goto LAB_0010afd9;
  }
  if (pcVar10[1] == 'a') {
    bVar2 = 1;
    kVar4 = KEYACT_CLIENT_ADD;
    if (pcVar10[2] == '\0') goto LAB_0010afd9;
  }
  if (pcVar10[1] == 'd') {
    bVar2 = 1;
    kVar4 = KEYACT_CLIENT_DEL;
    if (pcVar10[2] == '\0') goto LAB_0010afd9;
  }
  if (pcVar10[1] == 'r') {
    bVar2 = 1;
    kVar4 = KEYACT_CLIENT_REENCRYPT;
    if (pcVar10[2] == '\0') goto LAB_0010afd9;
  }
  if ((pcVar10[1] == 's') && (pcVar10[2] == '\0')) {
    shell_type = ADDRTYPE_IPV4;
    goto LAB_0010b2c8;
  }
  if ((pcVar10[1] == 'c') && (pcVar10[2] == '\0')) {
    shell_type = ADDRTYPE_IPV6;
    goto LAB_0010b2c8;
  }
  if ((pcVar10[1] == 'D') && (pcVar10[2] == '\0')) {
    kVar4 = KEYACT_CLIENT_DEL_ALL;
LAB_0010b2c0:
    add_keyact(kVar4,(char *)0x0);
    goto LAB_0010b2c8;
  }
  if ((pcVar10[1] == 'R') && (pcVar10[2] == '\0')) {
    kVar4 = KEYACT_CLIENT_REENCRYPT_ALL;
    goto LAB_0010b2c0;
  }
  if ((pcVar10[1] == 'l') && (pcVar10[2] == '\0')) {
    kVar4 = KEYACT_CLIENT_LIST;
    goto LAB_0010b2c0;
  }
  iVar6 = strcmp(pcVar10,"--public");
  bVar2 = 1;
  kVar4 = KEYACT_CLIENT_PUBLIC;
  if (iVar6 != 0) {
    iVar6 = strcmp(pcVar10,"--public-openssh");
    bVar2 = 1;
    kVar4 = KEYACT_CLIENT_PUBLIC_OPENSSH;
    if (iVar6 != 0) {
      if (pcVar10[1] == 'L') {
        bVar2 = 1;
        kVar4 = KEYACT_CLIENT_PUBLIC_OPENSSH;
        if (pcVar10[2] == '\0') goto LAB_0010afd9;
      }
      if ((pcVar10[1] == 'X') && (pcVar10[2] == '\0')) {
        life = ADDRTYPE_IPV4;
        goto LAB_0010b2c8;
      }
      if ((pcVar10[1] == 'T') && (pcVar10[2] == '\0')) {
        life = ADDRTYPE_IPV6;
        goto LAB_0010b2c8;
      }
      iVar6 = strcmp(pcVar10,"--no-decrypt");
      if (((((iVar6 == 0) || (iVar6 = strcmp(pcVar10,"-no-decrypt"), iVar6 == 0)) ||
           (iVar6 = strcmp(pcVar10,"--no_decrypt"), iVar6 == 0)) ||
          ((iVar6 = strcmp(pcVar10,"-no_decrypt"), iVar6 == 0 ||
           (iVar6 = strcmp(pcVar10,"--nodecrypt"), iVar6 == 0)))) ||
         ((iVar6 = strcmp(pcVar10,"-nodecrypt"), iVar6 == 0 ||
          ((iVar6 = strcmp(pcVar10,"--encrypted"), iVar6 == 0 ||
           (iVar6 = strcmp(pcVar10,"-encrypted"), iVar6 == 0)))))) {
        bVar2 = 1;
        kVar4 = KEYACT_AGENT_LOAD_ENCRYPTED;
        if (action != KEYACT_AGENT_LOAD) {
          if (action != KEYACT_CLIENT_ADD) {
            pcVar10 = "pageant: unexpected -E while not adding keys\n";
LAB_0010b69e:
            sStack_60 = 0x2d;
            goto LAB_0010b67c;
          }
          bVar2 = 1;
          kVar4 = KEYACT_CLIENT_ADD_ENCRYPTED;
        }
      }
      else {
        iVar6 = strcmp(pcVar10,"--debug");
        if (iVar6 == 0) {
          life = ADDRTYPE_LOCAL;
          goto LAB_0010b2c8;
        }
        iVar6 = strcmp(pcVar10,"--test-sign");
        if (iVar6 == 0) {
          sign_flags = 0;
LAB_0010b323:
          bVar2 = 1;
          kVar4 = KEYACT_CLIENT_SIGN;
        }
        else {
          _Var5 = strstartswith(pcVar10,"--test-sign-with-flags=");
          if (_Var5) {
            sign_flags = atoi(pcVar10 + 0x17);
            goto LAB_0010b323;
          }
          iVar6 = strcmp(pcVar10,"--permanent");
          if (iVar6 == 0) {
            life = ADDRTYPE_NAME;
            goto LAB_0010b2c8;
          }
          iVar6 = strcmp(pcVar10,"--exec");
          if (iVar6 == 0) {
            life = CS_ISO8859_4;
            if (local_4c == 2) {
              pcVar10 = "pageant: expected a command after --exec\n";
              sStack_60 = 0x29;
              goto LAB_0010b67c;
            }
            exec_args = ppcVar11 + 2;
            local_4c = 0;
            bVar2 = 1;
            argv = exec_args;
            iVar7 = local_4c;
            kVar4 = action;
          }
          else {
            iVar6 = strcmp(pcVar10,"--tty-prompt");
            if (iVar6 == 0) {
              prompt_type = ADDRTYPE_IPV4;
              goto LAB_0010b2c8;
            }
            iVar6 = strcmp(pcVar10,"--gui-prompt");
            if (iVar6 == 0) {
              prompt_type = ADDRTYPE_IPV6;
              goto LAB_0010b2c8;
            }
            iVar6 = strcmp(pcVar10,"--askpass");
            if (iVar6 == 0) {
              if (local_4c == 2) {
                pcVar10 = "pageant: expected a prompt message after --askpass\n";
                sStack_60 = 0x33;
                goto LAB_0010b67c;
              }
              local_40 = ppcVar11[2];
LAB_0010b4f6:
              bVar2 = 1;
              argv = ppcVar11 + 2;
              iVar7 = local_4c + -2;
              kVar4 = action;
            }
            else {
              iVar6 = strcmp(pcVar10,"--symlink");
              if (iVar6 == 0) {
                if (local_4c == 2) {
                  pcVar10 = "pageant: expected a pathname after --symlink\n";
                  goto LAB_0010b69e;
                }
                local_48 = ppcVar11[2];
                goto LAB_0010b4f6;
              }
              cVar1 = *pcVar10;
              if ((((cVar1 == '-') && (pcVar10[1] == 'E')) && (pcVar10[2] == '\0')) ||
                 (iVar6 = strcmp(pcVar10,"--fptype"), iVar6 == 0)) {
                if (local_4c == 2) {
                  __format = "pageant: expected a type string after %s\n";
                }
                else {
                  pcVar10 = ppcVar11[2];
                  iVar7 = strcmp(pcVar10,"md5");
                  if ((iVar7 == 0) || (iVar6 = strcmp(pcVar10,"sha256"), iVar6 == 0)) {
                    key_list_fptype = iVar7 == 0;
                    goto LAB_0010b4f6;
                  }
                  __format = "pageant: unknown fingerprint type `%s\'\n";
                }
                goto LAB_0010b758;
              }
              if (((cVar1 != '-') || (pcVar10[1] != '-')) ||
                 (bVar2 = 0, kVar4 = action, pcVar10[2] != '\0')) {
                __format = "pageant: unrecognised option \'%s\'\n";
LAB_0010b758:
                fprintf(_stderr,__format,pcVar10);
LAB_0010b685:
                exit(1);
              }
            }
          }
        }
      }
    }
  }
  goto LAB_0010afd9;
}

Assistant:

int main(int argc, char **argv)
{
    bool doing_opts = true;
    keyact curr_keyact = KEYACT_AGENT_LOAD;
    const char *standalone_askpass_prompt = NULL;
    const char *symlink_path = NULL;
    FILE *logfp = NULL;

    progname = argv[0];

    /*
     * Process the command line.
     */
    while (--argc > 0) {
        char *p = *++argv;
        if (*p == '-' && doing_opts) {
            if (!strcmp(p, "-V") || !strcmp(p, "--version")) {
                version();
            } else if (!strcmp(p, "--help")) {
                usage();
                exit(0);
            } else if (!strcmp(p, "-v")) {
                logfp = stderr;
            } else if (!strcmp(p, "-a")) {
                curr_keyact = KEYACT_CLIENT_ADD;
            } else if (!strcmp(p, "-d")) {
                curr_keyact = KEYACT_CLIENT_DEL;
            } else if (!strcmp(p, "-r")) {
                curr_keyact = KEYACT_CLIENT_REENCRYPT;
            } else if (!strcmp(p, "-s")) {
                shell_type = SHELL_SH;
            } else if (!strcmp(p, "-c")) {
                shell_type = SHELL_CSH;
            } else if (!strcmp(p, "-D")) {
                add_keyact(KEYACT_CLIENT_DEL_ALL, NULL);
            } else if (!strcmp(p, "-R")) {
                add_keyact(KEYACT_CLIENT_REENCRYPT_ALL, NULL);
            } else if (!strcmp(p, "-l")) {
                add_keyact(KEYACT_CLIENT_LIST, NULL);
            } else if (!strcmp(p, "--public")) {
                curr_keyact = KEYACT_CLIENT_PUBLIC;
            } else if (!strcmp(p, "--public-openssh") || !strcmp(p, "-L")) {
                curr_keyact = KEYACT_CLIENT_PUBLIC_OPENSSH;
            } else if (!strcmp(p, "-X")) {
                life = LIFE_X11;
            } else if (!strcmp(p, "-T")) {
                life = LIFE_TTY;
            } else if (!strcmp(p, "--no-decrypt") ||
                       !strcmp(p, "-no-decrypt") ||
                       !strcmp(p, "--no_decrypt") ||
                       !strcmp(p, "-no_decrypt") ||
                       !strcmp(p, "--nodecrypt") ||
                       !strcmp(p, "-nodecrypt") ||
                       !strcmp(p, "--encrypted") ||
                       !strcmp(p, "-encrypted")) {
                if (curr_keyact == KEYACT_AGENT_LOAD)
                    curr_keyact = KEYACT_AGENT_LOAD_ENCRYPTED;
                else if (curr_keyact == KEYACT_CLIENT_ADD)
                    curr_keyact = KEYACT_CLIENT_ADD_ENCRYPTED;
                else {
                    fprintf(stderr, "pageant: unexpected -E while not adding "
                            "keys\n");
                    exit(1);
                }
            } else if (!strcmp(p, "--debug")) {
                life = LIFE_DEBUG;
            } else if (!strcmp(p, "--test-sign")) {
                curr_keyact = KEYACT_CLIENT_SIGN;
                sign_flags = 0;
            } else if (strstartswith(p, "--test-sign-with-flags=")) {
                curr_keyact = KEYACT_CLIENT_SIGN;
                sign_flags = atoi(p + strlen("--test-sign-with-flags="));
            } else if (!strcmp(p, "--permanent")) {
                life = LIFE_PERM;
            } else if (!strcmp(p, "--exec")) {
                life = LIFE_EXEC;
                /* Now all subsequent arguments go to the exec command. */
                if (--argc > 0) {
                    exec_args = ++argv;
                    argc = 0;          /* force end of option processing */
                } else {
                    fprintf(stderr, "pageant: expected a command "
                            "after --exec\n");
                    exit(1);
                }
            } else if (!strcmp(p, "--tty-prompt")) {
                prompt_type = PROMPT_TTY;
            } else if (!strcmp(p, "--gui-prompt")) {
                prompt_type = PROMPT_GUI;
            } else if (!strcmp(p, "--askpass")) {
                if (--argc > 0) {
                    standalone_askpass_prompt = *++argv;
                } else {
                    fprintf(stderr, "pageant: expected a prompt message "
                            "after --askpass\n");
                    exit(1);
                }
            } else if (!strcmp(p, "--symlink")) {
                if (--argc > 0) {
                    symlink_path = *++argv;
                } else {
                    fprintf(stderr, "pageant: expected a pathname "
                            "after --symlink\n");
                    exit(1);
                }
            } else if (!strcmp(p, "-E") || !strcmp(p, "--fptype")) {
                const char *keyword;
                if (--argc > 0) {
                    keyword = *++argv;
                } else {
                    fprintf(stderr, "pageant: expected a type string "
                            "after %s\n", p);
                    exit(1);
                }
                if (!strcmp(keyword, "md5"))
                    key_list_fptype = SSH_FPTYPE_MD5;
                else if (!strcmp(keyword, "sha256"))
                    key_list_fptype = SSH_FPTYPE_SHA256;
                else {
                    fprintf(stderr, "pageant: unknown fingerprint type `%s'\n",
                            keyword);
                    exit(1);
                }
            } else if (!strcmp(p, "--")) {
                doing_opts = false;
            } else {
                fprintf(stderr, "pageant: unrecognised option '%s'\n", p);
                exit(1);
            }
        } else {
            /*
             * Non-option arguments (apart from those after --exec,
             * which are treated specially above) are interpreted as
             * the names of private key files to either add or delete
             * from an agent.
             */
            add_keyact(curr_keyact, p);
        }
    }

    if (life == LIFE_EXEC && !exec_args) {
        fprintf(stderr, "pageant: expected a command with --exec\n");
        exit(1);
    }

    if (!display) {
        display = getenv("DISPLAY");
        if (display && !*display)
            display = NULL;
    }

    /*
     * Deal with standalone-askpass mode.
     */
    if (standalone_askpass_prompt) {
        char *passphrase = askpass(standalone_askpass_prompt);

        if (!passphrase)
            return 1;

        puts(passphrase);
        fflush(stdout);

        smemclr(passphrase, strlen(passphrase));
        sfree(passphrase);
        return 0;
    }

    /*
     * Block SIGPIPE, so that we'll get EPIPE individually on
     * particular network connections that go wrong.
     */
    putty_signal(SIGPIPE, SIG_IGN);

    sk_init();
    uxsel_init();

    /*
     * Now distinguish our two main running modes. Either we're
     * actually starting up an agent, in which case we should have a
     * lifetime mode, and no key actions of KEYACT_CLIENT_* type; or
     * else we're contacting an existing agent to add or remove keys,
     * in which case we should have no lifetime mode, and no key
     * actions of KEYACT_AGENT_* type.
     */
    {
        bool has_agent_actions = false;
        bool has_client_actions = false;
        bool has_lifetime = false;
        const struct cmdline_key_action *act;

        for (act = keyact_head; act; act = act->next) {
            if (is_agent_action(act->action))
                has_agent_actions = true;
            else
                has_client_actions = true;
        }
        if (life != LIFE_UNSPEC)
            has_lifetime = true;

        if (has_lifetime && has_client_actions) {
            fprintf(stderr, "pageant: client key actions (-a, -d, -D, -r, -R, "
                    "-l, -L) do not go with an agent lifetime option\n");
            exit(1);
        }
        if (!has_lifetime && has_agent_actions) {
            fprintf(stderr, "pageant: expected an agent lifetime option with"
                    " bare key file arguments\n");
            exit(1);
        }
        if (!has_lifetime && !has_client_actions) {
            fprintf(stderr, "pageant: expected an agent lifetime option"
                    " or a client key action\n");
            exit(1);
        }

        if (has_lifetime) {
            run_agent(logfp, symlink_path);
        } else if (has_client_actions) {
            run_client();
        }
    }

    return 0;
}